

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_column_base.cpp
# Opt level: O0

void __thiscall
Base_z2_column_with_row_access_operators<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>
::test_method(Base_z2_column_with_row_access_operators<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>
              *this)

{
  vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>
  local_88;
  undefined1 local_70 [8];
  vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>
  matrix;
  Column_z2_settings local_41;
  undefined1 local_40 [7];
  Column_settings settings;
  Row_container rows;
  Base_z2_column_with_row_access_operators<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>
  *this_local;
  
  std::
  map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>_>_>_>
  ::map((map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>_>_>_>
         *)local_40);
  Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>
  ::Column_z2_settings::Column_z2_settings(&local_41);
  build_column_matrix<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>>>>>>
            ((vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>
              *)local_70,
             (map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>_>_>_>
              *)local_40,&local_41);
  column_test_common_z2_operators<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>
            ((vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>
              *)local_70);
  std::
  vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>
  ::clear((vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>
           *)local_70);
  std::
  map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>_>_>_>
  ::clear((map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>_>_>_>
           *)local_40);
  build_column_matrix<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>>>>>>
            (&local_88,
             (map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>_>_>_>
              *)local_40,&local_41);
  std::
  vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>
  ::operator=((vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>
               *)local_70,&local_88);
  std::
  vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>
  ::~vector(&local_88);
  column_test_base_z2_operators<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>
            ((vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>
              *)local_70);
  std::
  vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>
  ::~vector((vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>
             *)local_70);
  std::
  map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>_>_>_>
  ::~map((map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_>_>_>_>_>
          *)local_40);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(Base_z2_column_with_row_access_operators, Column, z2_only_row_access_columns) {
  typename Column::Master::Row_container rows;  // do not destroy before matrix
  typename Column::Column_settings settings;
  std::vector<Column> matrix = build_column_matrix<Column>(rows, settings);
  column_test_common_z2_operators(matrix);

  matrix.clear();
  rows.clear();
  matrix = build_column_matrix<Column>(rows, settings);
  column_test_base_z2_operators(matrix);
}